

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidArgsortWrongAxis(void)

{
  RepeatedField<long> *pRVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Tensor *obj;
  void *pvVar14;
  ArgSortLayerParams *pAVar15;
  ostream *poVar16;
  string *psVar17;
  long lVar18;
  undefined8 *puVar19;
  int iVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  uint32_t size;
  uint uVar22;
  Arena *pAVar23;
  Model m;
  Result res;
  Model local_a0;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  CoreML::Specification::Model::Model(&local_a0,(Arena *)0x0,false);
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_a0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bdc7a:
    pRVar21 = &(local_a0.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar20 = ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001bdc7a;
    ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar14 = pRVar4->elements[iVar20];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar22 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar22;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar22] = 5;
  uVar22 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar22;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar22] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_a0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bdde6:
    pRVar21 = &(local_a0.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar20 = ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001bdde6;
    ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar14 = pRVar4->elements[iVar20];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"output",puVar19);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar22 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar22;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar22] = 5;
  uVar22 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar22;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar22] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (local_a0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_a0);
    local_a0._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_a0.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  (local_a0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_a0.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bdf6d:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(local_a0.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar12);
  }
  else {
    iVar20 = (local_a0.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001bdf6d;
    (local_a0.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar20 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar20];
  }
  uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar12->name_,"argsort",puVar19);
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001bdfc8:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar20 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001bdfc8;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar14 = pRVar4->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001be018:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar20 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001be018;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar14 = pRVar4->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3dece7);
  pRVar4 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001be068:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                    ((pNVar12->inputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->inputtensor_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar20 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001be068;
    (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar14 = pRVar4->elements[iVar20];
  }
  *(undefined4 *)((long)pvVar14 + 0x24) = 3;
  if (pNVar12->_oneof_case_[0] != 0x5b5) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x5b5;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArgSortLayerParams>
                        (pAVar23);
    (pNVar12->layer_).argsort_ = pAVar15;
  }
  pCVar6 = (pNVar12->layer_).convolution_;
  (pCVar6->kernelsize_).current_size_ = -1;
  (pCVar6->kernelsize_).total_size_ = -1;
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_a0);
  bVar7 = CoreML::Result::good((Result *)local_70);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1757);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  else {
    psVar17 = CoreML::Result::message_abi_cxx11_((Result *)local_70);
    lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8c90,0);
    if (lVar18 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1758);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"res.message().find(\"axis\") != std::string::npos",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    }
    else {
      (pCVar6->kernelsize_).current_size_ = 3;
      (pCVar6->kernelsize_).total_size_ = 0;
      CoreML::validate<(MLModelType)500>((Result *)local_48,&local_a0);
      local_70 = local_48;
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_p != &local_30) {
        operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
      }
      bVar7 = CoreML::Result::good((Result *)local_70);
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x175d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      }
      else {
        psVar17 = CoreML::Result::message_abi_cxx11_((Result *)local_70);
        iVar20 = 0;
        lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8c90,0);
        if (lVar18 != -1) goto LAB_001be41d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x175e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"res.message().find(\"axis\") != std::string::npos",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      }
    }
  }
  std::ostream::put((char)poVar16);
  iVar20 = 1;
  std::ostream::flush();
LAB_001be41d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_a0);
  return iVar20;
}

Assistant:

int testInvalidArgsortWrongAxis() {

    // axis can't be negative or larger than equal to input rank

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->set_name("argsort");
    layers->add_input("input");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_argsort();

    // CASE 1: negative axis
    params->set_axis(-1);

    // axis should be in range [0, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    // CASE 2: axis greater than equal to input rank
    params->set_axis(3);
    res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;
}